

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeaveScriptObject.h
# Opt level: O1

void __thiscall
Js::LeaveScriptObject<true,_true,_false>::LeaveScriptObject
          (LeaveScriptObject<true,_true,_false> *this,ScriptContext *scriptContext,
          void *frameAddress)

{
  code *pcVar1;
  bool bVar2;
  Data DVar3;
  undefined4 *puVar4;
  
  this->scriptContext = scriptContext;
  this->frameAddress = frameAddress;
  SmartFPUControlT<false>::SmartFPUControlT(&this->savedFPUControl);
  bVar2 = ScriptContext::LeaveScriptStart<true,true>(scriptContext,frameAddress);
  this->leftScript = bVar2;
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Base/LeaveScriptObject.h"
                                ,0xa7,"(leftScript)","leftScript");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  DVar3 = ExceptionCheck::Save();
  (this->__exceptionCheck).handledExceptionType = DVar3.handledExceptionType;
  return;
}

Assistant:

LeaveScriptObject(ScriptContext *const scriptContext, void *const frameAddress)
            : scriptContext(scriptContext),
            frameAddress(frameAddress),
            savedFPUControl()
        {

            leftScript = scriptContext->LeaveScriptStart<stackProbe, leaveForHost>(frameAddress);

            // We should be in script when we leave
            Assert(leftScript);
            SAVE_EXCEPTION_CHECK;
        }